

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void AccessibilityCheckNode(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  int *piVar2;
  char cVar3;
  Dict *pDVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Bool BVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  TidyAttrId TVar15;
  int iVar16;
  TidyTagId TVar17;
  ctmbstr ptVar18;
  char *pcVar19;
  AttVal *pAVar20;
  Node *pNVar21;
  long lVar22;
  Node *pNVar23;
  uint maxExt;
  uint maxExt_00;
  Node *pNVar24;
  ctmbstr url;
  Node **ppNVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  Node *para;
  tmbstr ptVar30;
  tmbchar *pString;
  bool bVar31;
  tmbchar local_68 [32];
  tmbchar ext [20];
  
  pNVar23 = node;
  if ((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) {
    TVar17 = node->tag->id;
    switch(TVar17) {
    case TidyTag_IFRAME:
      if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00137ebf_caseD_3f;
      pAVar20 = prvTidyAttrGetById(node,TidyAttr_SRC);
      BVar11 = hasValue(pAVar20);
      if ((BVar11 == no) || (BVar11 = IsValidSrcExtension(pAVar20->value), BVar11 != no))
      goto switchD_00137ebf_caseD_3f;
      uVar12 = 0x16a;
      goto LAB_00138aeb;
    case TidyTag_ILAYER:
    case TidyTag_INS:
    case TidyTag_ISINDEX:
    case TidyTag_KBD:
    case TidyTag_KEYGEN:
      goto switchD_00136eef_caseD_33;
    case TidyTag_IMG:
      CheckFlicker(doc,node);
      CheckColorAvailable(doc,node);
      if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00137ebf_caseD_3f;
      pAVar20 = (AttVal *)&node->attributes;
      bVar7 = false;
      bVar9 = false;
      bVar5 = false;
      bVar31 = false;
      bVar10 = false;
      bVar6 = false;
LAB_0013733d:
      bVar8 = bVar6;
      pAVar20 = pAVar20->next;
      if (pAVar20 != (AttVal *)0x0) {
        bVar6 = bVar8;
        if (pAVar20->dict != (Attribute *)0x0) {
          TVar15 = pAVar20->dict->id;
          if (TVar15 == TidyAttr_WIDTH) {
            BVar11 = hasValue(pAVar20);
            if (BVar11 != no) {
              iVar16 = atoi(pAVar20->value);
              if (iVar16 < 0x1e) {
                bVar5 = true;
              }
              if (0x96 < iVar16) {
                bVar31 = true;
              }
            }
          }
          else if (TVar15 == TidyAttr_HEIGHT) {
            BVar11 = hasValue(pAVar20);
            if ((BVar11 != no) && (iVar16 = atoi(pAVar20->value), iVar16 < 0x1e)) {
              bVar9 = true;
            }
          }
          else if (TVar15 == TidyAttr_LONGDESC) {
            BVar11 = hasValue(pAVar20);
            if ((BVar11 != no) && (uVar12 = prvTidytmbstrlen(pAVar20->value), 1 < uVar12)) {
              bVar7 = true;
            }
          }
          else if (TVar15 == TidyAttr_USEMAP) {
            BVar11 = hasValue(pAVar20);
            if (BVar11 != no) {
              (doc->access).HasUseMap = yes;
            }
          }
          else if (TVar15 == TidyAttr_ALT) {
            if (pAVar20->value != (ctmbstr)0x0) {
              uVar12 = prvTidytmbstrlen(pAVar20->value);
              ptVar18 = pAVar20->value;
              if (((uVar12 < 0x96) && (BVar11 = IsPlaceholderAlt(ptVar18), BVar11 == no)) &&
                 (pcVar19 = strstr(ptVar18,"object"), pcVar19 == (char *)0x0)) {
                BVar11 = EndsWithBytes(ptVar18);
                ptVar18 = pAVar20->value;
                if (BVar11 == no) {
                  BVar11 = IsImage(ptVar18);
                  bVar6 = true;
                  if (BVar11 == no) goto LAB_0013733d;
                  ptVar18 = pAVar20->value;
                }
              }
              uVar12 = prvTidytmbstrlen(ptVar18);
              if (uVar12 < 0x97) {
                BVar11 = IsImage(pAVar20->value);
                if (BVar11 == no) {
                  ptVar18 = pAVar20->value;
                  BVar11 = IsPlaceholderAlt(ptVar18);
                  if (BVar11 != no) {
                    uVar12 = 0x12a;
                    goto LAB_00137412;
                  }
                  BVar11 = EndsWithBytes(ptVar18);
                  bVar6 = bVar8;
                  if (BVar11 == no) goto LAB_0013733d;
                  uVar12 = 0x129;
                }
                else {
                  uVar12 = 0x128;
                }
                prvTidyReportAccessWarning(doc,node,uVar12);
                bVar6 = true;
                goto LAB_0013733d;
              }
              uVar12 = 299;
LAB_00137412:
              prvTidyReportAccessWarning(doc,node,uVar12);
              bVar6 = true;
            }
          }
          else if (TVar15 == TidyAttr_ISMAP) {
            bVar10 = true;
          }
        }
        goto LAB_0013733d;
      }
      pNVar21 = node->next;
      bVar6 = false;
      if (((pNVar21 != (Node *)0x0) && (pNVar21->tag != (Dict *)0x0)) &&
         ((pNVar21->tag->id == TidyTag_A &&
          ((pNVar24 = pNVar21->content, pNVar23 = pNVar21, pNVar24 != (Node *)0x0 &&
           (pNVar24->tag == (Dict *)0x0)))))) {
        ptVar18 = textFromOneNode(doc,pNVar24);
        iVar16 = prvTidytmbstrcmp(ptVar18,"d");
        if ((iVar16 == 0) || (iVar16 = prvTidytmbstrcmp(ptVar18,"D"), bVar6 = false, iVar16 == 0)) {
          bVar6 = true;
        }
      }
      pNVar21 = pNVar23->next;
      if (((((pNVar21 != (Node *)0x0) && (pNVar21->tag == (Dict *)0x0)) &&
           (pNVar24 = pNVar21->next, pNVar23 = pNVar21, pNVar24 != (Node *)0x0)) &&
          ((pNVar24->tag != (Dict *)0x0 && (pNVar24->tag->id == TidyTag_A)))) &&
         ((pNVar21 = pNVar24->content, pNVar23 = pNVar24, pNVar21 != (Node *)0x0 &&
          (pNVar21->tag == (Dict *)0x0)))) {
        ptVar18 = textFromOneNode(doc,pNVar21);
        iVar16 = prvTidytmbstrcmp(ptVar18,"d");
        if ((iVar16 == 0) || (iVar16 = prvTidytmbstrcmp(ptVar18,"D"), iVar16 == 0)) {
          bVar6 = true;
        }
      }
      if (!bVar8) {
        prvTidyReportAccessError(doc,pNVar23,0x127);
      }
      if (((bVar7) || (!bVar9)) || (!bVar31 && !bVar5)) {
        uVar12 = 0x130;
        if ((bVar6 && !bVar7) || (uVar12 = 0x12f, bVar7 && !bVar6)) {
          prvTidyReportAccessWarning(doc,pNVar23,uVar12);
        }
        if (!bVar6 && !bVar7) {
          prvTidyReportAccessWarning(doc,pNVar23,0x12e);
        }
      }
      if (!bVar10) goto switchD_00137ebf_caseD_3f;
      prvTidyReportAccessError(doc,pNVar23,0x182);
      uVar12 = 0x13f;
      break;
    case TidyTag_INPUT:
      CheckColorAvailable(doc,node);
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
        pAVar20 = (AttVal *)&node->attributes;
        while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
          if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_ID)) &&
             (BVar11 = hasValue(pAVar20), BVar11 != no)) {
            (doc->access).HasValidId = yes;
          }
        }
        iVar16 = (doc->access).ForID + 1;
        (doc->access).ForID = iVar16;
        if (iVar16 == 2) {
          (doc->access).ForID = 0;
          CheckFormControls(doc,node);
        }
      }
      pAVar20 = (AttVal *)&node->attributes;
      bVar5 = false;
      bVar31 = false;
LAB_00137fbb:
      do {
        pAVar20 = pAVar20->next;
        if (pAVar20 == (AttVal *)0x0) goto LAB_0013802b;
        if (pAVar20->dict != (Attribute *)0x0) {
          TVar15 = pAVar20->dict->id;
          if (TVar15 == TidyAttr_TYPE) {
            BVar11 = hasValue(pAVar20);
            if ((((BVar11 != no) && (0xfffffffc < (doc->access).PRIORITYCHK - 4U)) &&
                (pAVar20->value != (ctmbstr)0x0)) &&
               (iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"image"), iVar16 == 0)) {
              bVar31 = true;
            }
            if (pAVar20->dict == (Attribute *)0x0) goto LAB_00137fbb;
            TVar15 = pAVar20->dict->id;
          }
          if ((TVar15 == TidyAttr_ALT) && (BVar11 = hasValue(pAVar20), BVar11 != no)) {
            bVar5 = true;
          }
        }
      } while( true );
    case TidyTag_LABEL:
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
        pAVar20 = prvTidyAttrGetById(node,TidyAttr_FOR);
        BVar11 = hasValue(pAVar20);
        if (BVar11 != no) {
          (doc->access).HasValidFor = yes;
        }
        iVar16 = (doc->access).ForID + 1;
        (doc->access).ForID = iVar16;
        if (iVar16 == 2) {
          (doc->access).ForID = 0;
          CheckFormControls(doc,node);
        }
      }
      goto switchD_00137ebf_caseD_3f;
    default:
      if (TVar17 != TidyTag_A) {
        if (TVar17 == TidyTag_APPLET) {
          CheckDeprecated(doc,node);
          ProgrammaticObjects(doc,node);
          DynamicContent(doc,node);
          AccessibleCompatible(doc,node);
          CheckFlicker(doc,node);
          CheckColorAvailable(doc,node);
          if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00137ebf_caseD_3f;
          pAVar20 = (AttVal *)&node->attributes;
          bVar31 = false;
          while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
            if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_ALT)) &&
               (pAVar20->value != (tmbstr)0x0)) {
              bVar31 = true;
            }
          }
          if (bVar31) goto switchD_00137ebf_caseD_3f;
          pNVar23 = node->content;
          if (pNVar23 != (Node *)0x0) {
            if (pNVar23->tag == (Dict *)0x0) {
              ptVar18 = textFromOneNode(doc,pNVar23);
              pNVar23 = node->content;
            }
            else {
              ptVar18 = (ctmbstr)0x0;
            }
            pNVar23 = pNVar23->content;
            if ((pNVar23 == (Node *)0x0) || (pNVar23->tag != (Dict *)0x0)) {
              if (ptVar18 == (ctmbstr)0x0) goto LAB_0013874d;
            }
            else {
              ptVar18 = textFromOneNode(doc,pNVar23);
            }
            BVar11 = IsWhitespace(ptVar18);
            if (BVar11 == no) goto switchD_00137ebf_caseD_3f;
          }
LAB_0013874d:
          uVar12 = 0x133;
          goto LAB_00138aeb;
        }
        if (TVar17 == TidyTag_AREA) {
          pAVar20 = (AttVal *)&node->attributes;
          bVar31 = false;
LAB_001375da:
          pAVar20 = pAVar20->next;
          uVar26 = (doc->access).PRIORITYCHK;
          if (pAVar20 != (AttVal *)0x0) {
            if (((0xfffffffc < uVar26 - 4) && (pAVar20->dict != (Attribute *)0x0)) &&
               ((pAVar20->dict->id == TidyAttr_ALT && (pAVar20->value != (tmbstr)0x0)))) {
              bVar31 = true;
            }
            if (((((uVar26 & 0xfffffffe) == 2) && (pAVar20->dict != (Attribute *)0x0)) &&
                (pAVar20->dict->id == TidyAttr_TARGET)) && (pAVar20->value != (ctmbstr)0x0)) {
              iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_new");
              if (iVar16 == 0) {
                uVar12 = 0x189;
              }
              else {
                if ((pAVar20->value == (ctmbstr)0x0) ||
                   (iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_blank"), iVar16 != 0))
                goto LAB_001375da;
                uVar12 = 0x18a;
              }
              prvTidyReportAccessWarning(doc,node,uVar12);
            }
            goto LAB_001375da;
          }
          if ((2 < uVar26 - 1) || (bVar31)) goto switchD_00137ebf_caseD_3f;
          uVar12 = 0x13c;
          goto LAB_00138aeb;
        }
        if (TVar17 != TidyTag_XMP) {
          if (TVar17 == TidyTag_FRAME) {
            piVar2 = &(doc->access).numFrames;
            *piVar2 = *piVar2 + 1;
            if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00137ebf_caseD_3f;
            pAVar20 = (AttVal *)&node->attributes;
            bVar31 = false;
LAB_00137739:
            pAVar20 = pAVar20->next;
            if (pAVar20 != (AttVal *)0x0) {
              if (pAVar20->dict != (Attribute *)0x0) {
                TVar15 = pAVar20->dict->id;
                if (TVar15 == TidyAttr_TITLE) {
                  BVar11 = hasValue(pAVar20);
                  if (BVar11 != no) {
                    bVar31 = true;
                  }
                  if (!bVar31) {
                    if ((pAVar20->value == (ctmbstr)0x0) ||
                       (uVar12 = prvTidytmbstrlen(pAVar20->value), uVar12 == 0)) {
                      uVar12 = 0x19b;
                    }
                    else {
                      BVar11 = IsWhitespace(pAVar20->value);
                      bVar31 = false;
                      if (BVar11 == no) goto LAB_00137739;
                      uVar12 = prvTidytmbstrlen(pAVar20->value);
                      bVar31 = false;
                      if (uVar12 == 0) goto LAB_00137739;
                      uVar12 = 0x19c;
                    }
                    prvTidyReportAccessError(doc,node,uVar12);
                    bVar31 = true;
                  }
                }
                else if (TVar15 == TidyAttr_SRC) {
                  BVar11 = hasValue(pAVar20);
                  if ((BVar11 != no) && (BVar11 = IsValidSrcExtension(pAVar20->value), BVar11 == no)
                     ) {
                    prvTidyReportAccessError(doc,node,0x16a);
                  }
                }
                else if (((TVar15 == TidyAttr_LONGDESC) &&
                         (BVar11 = hasValue(pAVar20), BVar11 != no)) &&
                        (uVar12 = prvTidytmbstrlen(pAVar20->value), 1 < uVar12)) {
                  piVar2 = &(doc->access).HasCheckedLongDesc;
                  *piVar2 = *piVar2 + 1;
                }
              }
              goto LAB_00137739;
            }
            if (!bVar31) {
              prvTidyReportAccessError(doc,node,0x19a);
            }
            if (((doc->access).numFrames != 3) || (2 < (doc->access).HasCheckedLongDesc))
            goto switchD_00137ebf_caseD_3f;
            (doc->access).numFrames = 0;
            uVar12 = 0x13b;
            break;
          }
          if (TVar17 == TidyTag_FRAMESET) {
            if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00137ebf_caseD_3f;
            if ((doc->badAccess & 0x40) != 0) {
              prvTidyReportAccessError(doc,node,0x175);
              *(byte *)&doc->badAccess = (byte)doc->badAccess & 0xbf;
            }
            bVar31 = false;
            ppNVar25 = &node->content;
            while (pNVar23 = *ppNVar25, pNVar23 != (Node *)0x0) {
              if ((pNVar23->tag == (Dict *)0x0) || (pNVar23->tag->id != TidyTag_NOFRAMES))
              goto LAB_00137ea8;
              pNVar21 = pNVar23->content;
              if (pNVar21 == (Node *)0x0) {
LAB_00137e96:
                uVar12 = 0x173;
                pNVar24 = pNVar23;
LAB_00137ea1:
                prvTidyReportAccessError(doc,pNVar24,uVar12);
                bVar31 = true;
              }
              else {
                pNVar24 = pNVar21->content;
                if (((pNVar24 == (Node *)0x0) || (pNVar24->tag == (Dict *)0x0)) ||
                   (pNVar24->tag->id != TidyTag_P)) {
                  ptVar18 = textFromOneNode(doc,pNVar21);
                  BVar11 = IsWhitespace(ptVar18);
                  bVar31 = true;
                  if (BVar11 != no) goto LAB_00137e96;
                }
                else {
                  BVar11 = prvTidynodeIsText(pNVar24->content);
                  bVar31 = true;
                  if (BVar11 != no) {
                    ptVar18 = textFromOneNode(doc,pNVar24->content);
                    pcVar19 = strstr(ptVar18,"browser");
                    bVar31 = true;
                    if (pcVar19 != (char *)0x0) {
                      uVar12 = 0x174;
                      goto LAB_00137ea1;
                    }
                  }
                }
              }
LAB_00137ea8:
              ppNVar25 = &pNVar23->next;
            }
            if (bVar31) goto switchD_00137ebf_caseD_3f;
            uVar12 = 0x172;
          }
          else if (TVar17 == TidyTag_HEAD) {
            BVar11 = CheckMetaData(doc,node,no);
            if ((BVar11 != no) || (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2))
            goto switchD_00137ebf_caseD_3f;
            uVar12 = 0x1a6;
          }
          else {
            if (TVar17 == TidyTag_MAP) {
              if ((doc->access).PRIORITYCHK == 3) {
                ppNVar25 = &node->content;
                while (pNVar23 = *ppNVar25, pNVar23 != (Node *)0x0) {
                  if ((pNVar23->tag != (Dict *)0x0) && (pNVar23->tag->id == TidyTag_AREA)) {
                    pAVar20 = prvTidyAttrGetById(pNVar23,TidyAttr_HREF);
                    BVar11 = hasValue(pAVar20);
                    if ((BVar11 != no) &&
                       (BVar11 = FindLinkA(doc,(Node *)pAVar20->value,url), BVar11 == no)) {
                      prvTidyReportAccessError(doc,node,0x141);
                    }
                  }
                  ppNVar25 = &pNVar23->next;
                }
              }
              goto switchD_00137ebf_caseD_3f;
            }
            if (TVar17 == TidyTag_OBJECT) {
              ProgrammaticObjects(doc,node);
              DynamicContent(doc,node);
              AccessibleCompatible(doc,node);
              CheckFlicker(doc,node);
              CheckColorAvailable(doc,node);
              if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00137ebf_caseD_3f;
              pNVar23 = node->content;
              if (pNVar23 != (Node *)0x0) {
                if (pNVar23->type != TextNode) {
                  pAVar20 = (AttVal *)&pNVar23->attributes;
                  do {
                    pAVar20 = pAVar20->next;
                    if (pAVar20 == (AttVal *)0x0) goto LAB_00137a6f;
                  } while ((pAVar20->dict == (Attribute *)0x0) ||
                          (pAVar20->dict->id != TidyAttr_ALT));
                  goto switchD_00137ebf_caseD_3f;
                }
LAB_00137a6f:
                BVar11 = prvTidynodeIsText(pNVar23);
                pNVar23 = node->content;
                if (BVar11 == no) {
                  BVar11 = prvTidynodeIsText(pNVar23->content);
                  if (BVar11 == no) goto LAB_00137aa9;
                  pNVar23 = node->content->content;
                }
                ptVar18 = textFromOneNode(doc,pNVar23);
                BVar11 = IsWhitespace(ptVar18);
                if (BVar11 == no) goto switchD_00137ebf_caseD_3f;
              }
LAB_00137aa9:
              uVar12 = 0x134;
            }
            else {
              if (TVar17 == TidyTag_PRE) goto LAB_0013711b;
              if (TVar17 == TidyTag_SCRIPT) {
                DynamicContent(doc,node);
                ProgrammaticObjects(doc,node);
                AccessibleCompatible(doc,node);
                CheckFlicker(doc,node);
                CheckColorAvailable(doc,node);
                if (((doc->access).PRIORITYCHK - 4U < 0xfffffffd) ||
                   (((node->next != (Node *)0x0 && (pDVar4 = node->next->tag, pDVar4 != (Dict *)0x0)
                     ) && (pDVar4->id == TidyTag_NOSCRIPT)))) goto switchD_00137ebf_caseD_3f;
                uVar12 = 0x13d;
              }
              else {
                if (TVar17 != TidyTag_TABLE) {
                  if (TVar17 == TidyTag_BODY) {
                    CheckColorContrast(doc,node);
                    goto switchD_00137ebf_caseD_3f;
                  }
                  goto switchD_00136eef_caseD_33;
                }
                CheckColorContrast(doc,node);
                iVar16 = (doc->access).PRIORITYCHK;
                bVar31 = true;
                if (iVar16 == 3) {
                  pAVar20 = (AttVal *)&node->attributes;
                  bVar31 = false;
LAB_00137856:
                  pAVar20 = pAVar20->next;
                  if (pAVar20 != (AttVal *)0x0) {
                    if ((pAVar20->dict != (Attribute *)0x0) &&
                       (pAVar20->dict->id == TidyAttr_SUMMARY)) {
                      BVar11 = hasValue(pAVar20);
                      if (BVar11 != no) {
                        bVar31 = true;
                        if (pAVar20->value != (ctmbstr)0x0) {
                          ptVar18 = prvTidytmbsubstr(pAVar20->value,"summary");
                          bVar31 = true;
                          if (ptVar18 != (ctmbstr)0x0) {
                            bVar31 = true;
                            if (pAVar20->value != (ctmbstr)0x0) {
                              ptVar18 = prvTidytmbsubstr(pAVar20->value,"table");
                              bVar31 = true;
                              if (ptVar18 != (ctmbstr)0x0) {
                                prvTidyReportAccessError(doc,node,0x162);
                                bVar31 = true;
                              }
                            }
                          }
                        }
                      }
                      uVar12 = 0x160;
                      if ((pAVar20->value != (ctmbstr)0x0) &&
                         (uVar13 = prvTidytmbstrlen(pAVar20->value), uVar13 != 0)) {
                        BVar11 = IsWhitespace(pAVar20->value);
                        if (BVar11 == no) goto LAB_00137856;
                        uVar13 = prvTidytmbstrlen(pAVar20->value);
                        uVar12 = 0x161;
                        if (uVar13 == 0) goto LAB_00137856;
                      }
                      prvTidyReportAccessError(doc,node,uVar12);
                      bVar31 = true;
                    }
                    goto LAB_00137856;
                  }
                  if (node->content == (Node *)0x0) {
                    uVar12 = 0x158;
                    goto LAB_00138aeb;
                  }
                  iVar16 = (doc->access).PRIORITYCHK;
                  bVar31 = !bVar31;
                }
                if ((0xfffffffc < iVar16 - 4U) && (pNVar23 = node->content, pNVar23 != (Node *)0x0))
                {
                  bVar5 = true;
                  bVar7 = true;
                  for (; pNVar23 != (Node *)0x0; pNVar23 = pNVar23->next) {
                    if (((pNVar23->tag != (Dict *)0x0) && (pNVar23->tag->id == TidyTag_TR)) &&
                       (pNVar21 = pNVar23->content, pNVar21 != (Node *)0x0)) {
                      for (; pNVar21 != (Node *)0x0; pNVar21 = pNVar21->next) {
                        if ((pNVar21->tag != (Dict *)0x0) && (pNVar21->tag->id == TidyTag_TH)) {
                          pAVar20 = (AttVal *)&pNVar21->attributes;
                          while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
                            if (pAVar20->dict != (Attribute *)0x0) {
                              TVar15 = pAVar20->dict->id;
                              if (TVar15 == TidyAttr_ROWSPAN) {
                                iVar16 = atoi(pAVar20->value);
                                if (1 < iVar16) {
                                  bVar5 = false;
                                }
                              }
                              else if ((TVar15 == TidyAttr_COLSPAN) &&
                                      (iVar16 = atoi(pAVar20->value), 1 < iVar16)) {
                                bVar7 = false;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if (!bVar5) {
                    prvTidyReportAccessWarning(doc,node,0x15c);
                    prvTidyDisplayHTMLTableAlgorithm(doc);
                  }
                  if (!bVar7) {
                    prvTidyReportAccessWarning(doc,node,0x15b);
                    prvTidyDisplayHTMLTableAlgorithm(doc);
                  }
                }
                if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
                  pNVar23 = node->content;
                  if (((pNVar23 != (Node *)0x0) && (pNVar23->tag != (Dict *)0x0)) &&
                     (pNVar23->tag->id == TidyTag_CAPTION)) {
                    if ((pNVar23->content == (Node *)0x0) || (pNVar23->content->tag != (Dict *)0x0))
                    {
                      pString = (tmbchar *)0x0;
                    }
                    else {
                      pString = (doc->access).textNode;
                      memset(&(doc->access).counter,0,0x84);
                      getTextNode(doc,pNVar23->content);
                    }
                    BVar11 = IsWhitespace(pString);
                    if (BVar11 == no) goto LAB_0013881b;
                  }
                  prvTidyReportAccessError(doc,node,0x163);
                }
LAB_0013881b:
                pNVar23 = node->content;
                if (((pNVar23 != (Node *)0x0) && (pNVar23->tag != (Dict *)0x0)) &&
                   ((TVar17 = pNVar23->tag->id, TVar17 == TidyTag_TR ||
                    ((((TVar17 == TidyTag_CAPTION &&
                       (pNVar23 = pNVar23->next, pNVar23 != (Node *)0x0)) &&
                      (pNVar23->tag != (Dict *)0x0)) && (pNVar23->tag->id == TidyTag_TR)))))) {
                  piVar2 = &(doc->access).CheckedHeaders;
                  *piVar2 = *piVar2 + 1;
                  pNVar23 = pNVar23->content;
                  if (((pNVar23 != (Node *)0x0) && (pNVar23->tag != (Dict *)0x0)) &&
                     (pNVar23->tag->id == TidyTag_TH)) {
                    (doc->access).HasTH = yes;
                    iVar16 = 0;
                    bVar5 = false;
                    for (; pNVar23 != (Node *)0x0; pNVar23 = pNVar23->next) {
                      if ((pNVar23->tag == (Dict *)0x0) || (pNVar23->tag->id != TidyTag_TH)) {
                        bVar5 = true;
                      }
                      else {
                        BVar11 = prvTidynodeIsText(pNVar23->content);
                        if (BVar11 != no) {
                          ptVar18 = textFromOneNode(doc,pNVar23->content);
                          BVar11 = IsWhitespace(ptVar18);
                          iVar16 = iVar16 + (uint)(BVar11 == no);
                        }
                      }
                    }
                    if (((!bVar5) && (lVar22 = 0x32e8, 0 < iVar16)) ||
                       ((bVar5 && (lVar22 = 0x32f0, 1 < iVar16)))) {
                      *(undefined4 *)((long)(doc->config).value + lVar22 + -0x70) = 1;
                    }
                  }
                }
                if (((((doc->access).HasValidColumnHeaders == no) &&
                     (pNVar23 = node->content, pNVar23 != (Node *)0x0)) &&
                    (pNVar23->tag != (Dict *)0x0)) &&
                   ((TVar17 = pNVar23->tag->id, TVar17 == TidyTag_TR ||
                    (((TVar17 == TidyTag_CAPTION &&
                      (pNVar23 = pNVar23->next, pNVar23 != (Node *)0x0)) &&
                     ((pNVar23->tag != (Dict *)0x0 && (pNVar23->tag->id == TidyTag_TR)))))))) {
                  piVar2 = &(doc->access).CheckedHeaders;
                  *piVar2 = *piVar2 + 1;
                  uVar28 = 0;
                  uVar26 = 0;
                  for (; pNVar23 != (Node *)0x0; pNVar23 = pNVar23->next) {
                    pNVar21 = pNVar23->content;
                    if (((pNVar21 != (Node *)0x0) && (pNVar21->tag != (Dict *)0x0)) &&
                       (pNVar21->tag->id == TidyTag_TH)) {
                      (doc->access).HasTH = yes;
                      BVar11 = prvTidynodeIsText(pNVar21->content);
                      if (BVar11 != no) {
                        ptVar18 = textFromOneNode(doc,pNVar23->content->content);
                        BVar11 = IsWhitespace(ptVar18);
                        uVar26 = uVar26 + (BVar11 == no);
                      }
                    }
                    uVar28 = uVar28 + 1;
                  }
                  if (uVar28 == uVar26) {
                    (doc->access).HasValidRowHeaders = yes;
                  }
                  if (((1 < uVar28) && (1 < (int)uVar26 && (int)uVar26 < (int)uVar28)) &&
                     ((doc->access).HasTH == yes)) {
                    (doc->access).HasInvalidRowHeader = yes;
                  }
                }
                uVar26 = (doc->access).PRIORITYCHK;
                if ((bool)(uVar26 == 3 & bVar31)) {
                  prvTidyReportAccessError(doc,node,0x15f);
                  uVar26 = (doc->access).PRIORITYCHK;
                }
                if ((uVar26 & 0xfffffffe) == 2) {
                  pNVar23 = node->content;
                  if (pNVar23 != (Node *)0x0) {
                    iVar16 = 0;
                    for (; pNVar23 != (Node *)0x0; pNVar23 = pNVar23->next) {
                      if (pNVar23->tag != (Dict *)0x0) {
                        iVar16 = iVar16 + (uint)(pNVar23->tag->id == TidyTag_TR);
                      }
                    }
                    if (iVar16 == 1) {
                      prvTidyReportAccessWarning(doc,node,0x15d);
                    }
                  }
                  if ((doc->access).HasTH != no) {
                    prvTidyReportAccessWarning(doc,node,0x15e);
                  }
                }
                if (((doc->access).PRIORITYCHK - 4U < 0xfffffffd) ||
                   ((doc->access).CheckedHeaders != 2)) goto switchD_00137ebf_caseD_3f;
                if (((doc->access).HasValidRowHeaders == no) &&
                   (((((doc->access).HasValidColumnHeaders != no ||
                      ((doc->access).HasInvalidRowHeader != no)) ||
                     (((doc->access).HasInvalidColumnHeader != no ||
                      (prvTidyReportAccessError(doc,node,0x158),
                      (doc->access).HasValidRowHeaders == no)))) &&
                    ((doc->access).HasInvalidRowHeader != no)))) {
                  prvTidyReportAccessError(doc,node,0x15a);
                }
                if (((doc->access).HasValidColumnHeaders != no) ||
                   ((doc->access).HasInvalidColumnHeader == no)) goto switchD_00137ebf_caseD_3f;
                uVar12 = 0x159;
              }
            }
          }
          goto LAB_00138aeb;
        }
LAB_0013711b:
        uVar26 = (doc->access).PRIORITYCHK;
        if ((uVar26 - 4 < 0xfffffffd) || (pNVar23 = node->content, pNVar23 == (Node *)0x0)) {
LAB_001371fc:
          bVar31 = false;
LAB_001371ff:
          bVar5 = bVar31;
          iVar16 = 0;
          ptVar30 = (char *)0x0;
        }
        else {
          uVar29 = (ulong)(pNVar23->start + 1);
          lVar22 = 0;
          iVar16 = -1;
          uVar28 = pNVar23->start;
          do {
            uVar1 = uVar28 + 1;
            if (pNVar23->end <= uVar1) break;
            ptVar30 = doc->lexer->lexbuf;
            cVar3 = ptVar30[uVar1];
            iVar16 = iVar16 + (uint)(cVar3 == '\n');
            for (lVar22 = 0;
                (uVar29 + lVar22 < (ulong)(uVar28 + 6) && (ptVar30[lVar22 + uVar29] == cVar3));
                lVar22 = lVar22 + 1) {
            }
            uVar29 = uVar29 + 1;
            uVar28 = uVar1;
          } while ((uint)lVar22 < 5);
          if ((int)lVar22 < 5 && iVar16 < 6) goto LAB_001371fc;
          bVar5 = true;
          bVar31 = true;
          if ((node->prev == (Node *)0x0) || (pNVar23 = node->prev->prev, pNVar23 == (Node *)0x0))
          goto LAB_001371ff;
          pAVar20 = (AttVal *)&pNVar23->attributes;
          iVar16 = 0;
          ptVar30 = (tmbstr)0x0;
          while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
            if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_HREF)) &&
               (BVar11 = hasValue(pAVar20), BVar11 != no)) {
              ptVar30 = pAVar20->value;
              iVar16 = iVar16 + 1;
            }
          }
          uVar26 = (doc->access).PRIORITYCHK;
        }
        if ((uVar26 & 0xfffffffe) != 2) goto switchD_00137ebf_caseD_3f;
        if (iVar16 == 1) {
          pNVar23 = node->next;
          iVar16 = 1;
          if (((pNVar23 != (Node *)0x0) && (pNVar23->tag != (Dict *)0x0)) &&
             (pNVar23->tag->id == TidyTag_A)) {
            pAVar20 = (AttVal *)&pNVar23->attributes;
            iVar16 = 1;
            while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
              if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_NAME)) &&
                 (BVar11 = hasValue(pAVar20), BVar11 != no)) {
                pcVar19 = strstr(ptVar30,pAVar20->value);
                iVar16 = (iVar16 + 1) - (uint)(pcVar19 == (char *)0x0);
              }
            }
          }
        }
        if (((!bVar5) || (prvTidyReportAccessError(doc,node,0x13e), (doc->access).PRIORITYCHK != 3))
           || (1 < iVar16)) goto switchD_00137ebf_caseD_3f;
        uVar12 = 0x1a9;
        goto LAB_00138aeb;
      }
      pAVar20 = (AttVal *)&node->attributes;
      bVar31 = false;
LAB_00137ad2:
      pAVar20 = pAVar20->next;
      uVar26 = (doc->access).PRIORITYCHK;
      if (pAVar20 != (AttVal *)0x0) {
        if ((((0xfffffffc < uVar26 - 4) && (pAVar20->dict != (Attribute *)0x0)) &&
            (pAVar20->dict->id == TidyAttr_HREF)) && (BVar11 = hasValue(pAVar20), BVar11 != no)) {
          GetFileExtension(pAVar20->value,local_68,maxExt);
          BVar11 = IsValidMediaExtension(pAVar20->value);
          if (BVar11 != no) {
            prvTidyReportAccessError(doc,node,0x140);
          }
          uVar12 = prvTidytmbstrlen(local_68);
          if ((uVar12 < 6) && (uVar12 = prvTidytmbstrlen(local_68), uVar12 != 0)) {
            GetFileExtension(pAVar20->value,ext,maxExt_00);
            lVar22 = 0;
            do {
              lVar27 = lVar22;
              if (lVar27 == 0x18) goto LAB_00137bd0;
              iVar16 = prvTidytmbstrcasecmp
                                 (ext,(ctmbstr)((long)&soundExtensions_rel +
                                               (long)*(int *)((long)&soundExtensions_rel + lVar27)))
              ;
              lVar22 = lVar27 + 4;
            } while (iVar16 != 0);
            uVar12 = *(uint *)((long)soundExtErrCodes + lVar27);
            pNVar21 = node->next;
            if ((pNVar21 == (Node *)0x0) || (pNVar21->tag != (Dict *)0x0)) {
              bVar5 = !bVar31;
              bVar31 = true;
              if (bVar5) goto LAB_00137bba;
            }
            else {
              ptVar18 = textFromOneNode(doc,pNVar21);
              BVar11 = IsWhitespace(ptVar18);
              bVar5 = !bVar31;
              bVar31 = true;
              if (BVar11 != no && bVar5) {
LAB_00137bba:
                prvTidyReportAccessError(doc,node,uVar12);
                bVar31 = false;
              }
            }
          }
        }
LAB_00137bd0:
        if ((((((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) &&
             (pAVar20->dict != (Attribute *)0x0)) && (pAVar20->dict->id == TidyAttr_TARGET)) &&
           (pAVar20->value != (ctmbstr)0x0)) {
          iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_new");
          if (iVar16 == 0) {
            uVar12 = 0x189;
          }
          else {
            if ((pAVar20->value == (ctmbstr)0x0) ||
               (iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_blank"), iVar16 != 0))
            goto LAB_00137ad2;
            uVar12 = 0x18a;
          }
          prvTidyReportAccessWarning(doc,node,uVar12);
        }
        goto LAB_00137ad2;
      }
      if ((uVar26 & 0xfffffffe) != 2) goto switchD_00137ebf_caseD_3f;
      pNVar21 = node->content;
      if (pNVar21 != (Node *)0x0) {
        if (pNVar21->tag == (Dict *)0x0) {
          ptVar18 = textFromOneNode(doc,pNVar21);
          BVar11 = IsWhitespace(ptVar18);
          if (BVar11 == no) {
            iVar16 = prvTidytmbstrcmp(ptVar18,"more");
            iVar14 = prvTidytmbstrcmp(ptVar18,"click here");
            if (iVar14 == 0) {
              prvTidyReportAccessWarning(doc,node,0x1a3);
            }
            if ((iVar16 != 0) && (uVar12 = prvTidytmbstrlen(ptVar18), uVar12 < 6)) {
              prvTidyReportAccessWarning(doc,node,0x1a0);
            }
            uVar12 = prvTidytmbstrlen(ptVar18);
            if (0x3c < uVar12) {
              prvTidyReportAccessWarning(doc,node,0x1a2);
            }
          }
        }
        if (node->content != (Node *)0x0) goto switchD_00137ebf_caseD_3f;
      }
      uVar12 = 0x1a1;
    }
    goto LAB_00137111;
  }
switchD_00136eef_caseD_33:
  BVar11 = prvTidynodeIsHeader(node);
  if (BVar11 == no) {
    if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) goto switchD_00137ebf_caseD_3f;
    TVar17 = node->tag->id;
    switch(TVar17) {
    case TidyTag_LI:
switchD_00137ebf_caseD_3d:
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) break;
      if (TVar17 == TidyTag_LI) {
        uVar12 = 0x154;
        if (((node->parent != (Node *)0x0) && (pDVar4 = node->parent->tag, pDVar4 != (Dict *)0x0))
           && ((TVar17 = pDVar4->id, TVar17 == TidyTag_UL || (TVar17 == TidyTag_OL)))) {
          if (node->implicit == no) break;
          uVar12 = TVar17 == TidyTag_UL ^ 0x153;
        }
      }
      else {
        if (TVar17 == TidyTag_OL) {
          uVar12 = 0x153;
        }
        else {
          if (TVar17 != TidyTag_UL) break;
          uVar12 = 0x152;
        }
        if ((((node->content != (Node *)0x0) && (pDVar4 = node->content->tag, pDVar4 != (Dict *)0x0)
             ) && (pDVar4->id == TidyTag_LI)) && (uVar12 = 0x154, node->implicit == no)) break;
      }
      goto LAB_00137111;
    case TidyTag_LINK:
      if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
        pAVar20 = (AttVal *)&node->attributes;
        bVar31 = false;
        bVar5 = false;
LAB_00138319:
        do {
          pAVar20 = pAVar20->next;
          if (pAVar20 == (AttVal *)0x0) goto LAB_00138584;
          if (pAVar20->dict != (Attribute *)0x0) {
            TVar15 = pAVar20->dict->id;
            if (TVar15 == TidyAttr_REL) {
              BVar11 = hasValue(pAVar20);
              if (((BVar11 != no) && (pAVar20->value != (ctmbstr)0x0)) &&
                 (ptVar18 = prvTidytmbsubstr(pAVar20->value,"stylesheet"), ptVar18 != (ctmbstr)0x0))
              {
                bVar31 = true;
              }
              if (pAVar20->dict == (Attribute *)0x0) goto LAB_00138319;
              TVar15 = pAVar20->dict->id;
            }
            if ((TVar15 == TidyAttr_TYPE) && (BVar11 = hasValue(pAVar20), BVar11 != no)) {
              bVar5 = true;
            }
          }
        } while( true );
      }
      break;
    case TidyTag_LISTING:
    case TidyTag_MAP:
    case TidyTag_MATHML:
      break;
    case TidyTag_MARQUEE:
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) break;
LAB_00138432:
      BVar11 = prvTidynodeIsText(pNVar23);
      if (BVar11 == no) break;
      ptVar18 = textFromOneNode(doc,node->content);
      BVar11 = IsWhitespace(ptVar18);
      if (BVar11 != no) break;
      uVar12 = 0x17b;
      goto LAB_00138aeb;
    case TidyTag_MENU:
switchD_00137ebf_caseD_43:
      CheckDeprecated(doc,node);
      break;
    default:
      if (TVar17 == TidyTag_BASEFONT) goto switchD_00137ebf_caseD_43;
      if (TVar17 == TidyTag_BLINK) {
        if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) break;
        pNVar23 = node->content;
        goto LAB_00138432;
      }
      if ((TVar17 == TidyTag_CENTER) || (TVar17 == TidyTag_DIR)) goto switchD_00137ebf_caseD_43;
      if (TVar17 == TidyTag_EMBED) {
        if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
          pAVar20 = prvTidyAttrGetById(node,TidyAttr_SRC);
          BVar11 = hasValue(pAVar20);
          if ((BVar11 != no) && (BVar11 = IsValidMediaExtension(pAVar20->value), BVar11 != no)) {
            prvTidyReportAccessError(doc,node,0x140);
          }
        }
        ProgrammaticObjects(doc,node);
        AccessibleCompatible(doc,node);
        CheckFlicker(doc,node);
        break;
      }
      if (TVar17 == TidyTag_FONT) goto switchD_00137ebf_caseD_43;
      if (TVar17 == TidyTag_HTML) {
        if ((doc->access).PRIORITYCHK != 3) break;
        pAVar20 = prvTidyAttrGetById(node,TidyAttr_LANG);
        if (pAVar20 == (AttVal *)0x0) {
          uVar12 = 0x156;
        }
        else {
          BVar11 = hasValue(pAVar20);
          if (BVar11 != no) break;
          uVar12 = 0x157;
        }
        goto LAB_00138aeb;
      }
      if (TVar17 == TidyTag_ISINDEX) goto switchD_00137ebf_caseD_43;
      if ((TVar17 == TidyTag_OL) || (TVar17 == TidyTag_UL)) goto switchD_00137ebf_caseD_3d;
      if ((TVar17 == TidyTag_S) || (TVar17 == TidyTag_STRIKE)) goto switchD_00137ebf_caseD_43;
      if (TVar17 == TidyTag_STYLE) {
        CheckColorContrast(doc,node);
        if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) break;
        uVar12 = 0x168;
      }
      else if (TVar17 == TidyTag_TH) {
        if ((doc->access).PRIORITYCHK != 3) break;
        pAVar20 = (AttVal *)&node->attributes;
        bVar31 = false;
        while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
          if ((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_ABBR)) {
            if (pAVar20->value == (ctmbstr)0x0) {
LAB_001384c3:
              prvTidyReportAccessWarning(doc,node,0x165);
              bVar31 = true;
            }
            else {
              BVar11 = IsWhitespace(pAVar20->value);
              if (pAVar20->value == (ctmbstr)0x0) goto LAB_001384c3;
              if (BVar11 == no) {
                bVar31 = true;
              }
              uVar12 = prvTidytmbstrlen(pAVar20->value);
              if (uVar12 == 0) goto LAB_001384c3;
            }
            BVar11 = IsWhitespace(pAVar20->value);
            if ((BVar11 == yes) && (uVar12 = prvTidytmbstrlen(pAVar20->value), uVar12 != 0)) {
              prvTidyReportAccessWarning(doc,node,0x166);
              bVar31 = true;
            }
          }
        }
        ptVar18 = textFromOneNode(doc,node->content);
        BVar11 = IsWhitespace(ptVar18);
        if (((BVar11 != no) || (uVar12 = prvTidytmbstrlen(ptVar18), uVar12 < 0x10)) || (bVar31))
        break;
        uVar12 = 0x164;
      }
      else {
        if (TVar17 == TidyTag_U) goto switchD_00137ebf_caseD_43;
        if (((TVar17 != TidyTag_P) || (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2)) ||
           ((pNVar21 = node->content, pNVar21 == (Node *)0x0 ||
            (pNVar24 = pNVar21, pNVar21->tag == (Dict *)0x0)))) break;
        for (; pNVar24 != (Node *)0x0; pNVar24 = pNVar24->next) {
          if (pNVar24->tag == (Dict *)0x0) goto switchD_00137ebf_caseD_3f;
        }
        if (pNVar21->tag->id == TidyTag_STRONG) {
          prvTidyReportAccessWarning(doc,node,0x14e);
          pNVar21 = node->content;
        }
        if ((pNVar21 == (Node *)0x0) || (pNVar21->tag == (Dict *)0x0)) break;
        TVar17 = pNVar21->tag->id;
        if (TVar17 == TidyTag_U) {
          prvTidyReportAccessWarning(doc,node,0x150);
          if ((node->content == (Node *)0x0) || (pDVar4 = node->content->tag, pDVar4 == (Dict *)0x0)
             ) break;
          TVar17 = pDVar4->id;
        }
        if (TVar17 != TidyTag_EM) break;
        uVar12 = 0x14f;
      }
      goto LAB_00137111;
    }
  }
  else {
    if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) goto switchD_00137ebf_caseD_3f;
    pNVar21 = node->content;
    bVar31 = true;
    if ((pNVar21 != (Node *)0x0) && (pNVar21->tag == (Dict *)0x0)) {
      ptVar18 = textFromOneNode(doc,pNVar21);
      uVar26 = 1;
      for (uVar29 = 0; uVar12 = prvTidytmbstrlen(ptVar18), uVar29 < uVar12; uVar29 = uVar29 + 1) {
        uVar26 = uVar26 + (ptVar18[uVar29] == ' ');
      }
      bVar31 = uVar26 < 0x15;
    }
    BVar11 = prvTidynodeIsHeader(node);
    if (BVar11 == no) {
LAB_001370ed:
      prvTidyReportAccessWarning(doc,node,0x14d);
    }
    else {
      uVar12 = prvTidynodeHeaderLevel(node);
      pNVar21 = node;
      do {
        pNVar21 = pNVar21->next;
        if (pNVar21 == (Node *)0x0) goto LAB_001370fd;
        uVar13 = prvTidynodeHeaderLevel(pNVar21);
      } while (uVar13 < uVar12);
      if (uVar12 + 1 < uVar13) goto LAB_001370ed;
    }
LAB_001370fd:
    if (bVar31) goto switchD_00137ebf_caseD_3f;
    uVar12 = 0x151;
LAB_00137111:
    prvTidyReportAccessWarning(doc,pNVar23,uVar12);
  }
switchD_00137ebf_caseD_3f:
  ppNVar25 = &node->content;
  while (pNVar23 = *ppNVar25, pNVar23 != (Node *)0x0) {
    AccessibilityCheckNode(doc,pNVar23);
    ppNVar25 = &pNVar23->next;
  }
  return;
LAB_0013802b:
  if ((!bVar31) || (bVar5)) goto switchD_00137ebf_caseD_3f;
  uVar12 = 0x132;
LAB_00138aeb:
  prvTidyReportAccessError(doc,node,uVar12);
  goto switchD_00137ebf_caseD_3f;
LAB_00138584:
  if ((!bVar31) || (!bVar5)) goto switchD_00137ebf_caseD_3f;
  uVar12 = 0x167;
  goto LAB_00137111;
}

Assistant:

static void AccessibilityCheckNode( TidyDocImpl* doc, Node* node )
{
    Node* content;
    
    /* Check BODY for color contrast */
    if ( nodeIsBODY(node) )
    {
        CheckColorContrast( doc, node );
    }

    /* Checks document for MetaData */
    else if ( nodeIsHEAD(node) )
    {
        if ( !CheckMetaData( doc, node, no ) )
          MetaDataPresent( doc, node );
    }
    
    /* Check the ANCHOR tag */
    else if ( nodeIsA(node) )
    {
        CheckAnchorAccess( doc, node );
    }

    /* Check the IMAGE tag */
    else if ( nodeIsIMG(node) )
    {
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckImage( doc, node );
    }

        /* Checks MAP for client-side text links */
    else if ( nodeIsMAP(node) )
    {
        CheckMapLinks( doc, node );
    }

    /* Check the AREA tag */
    else if ( nodeIsAREA(node) )
    {
        CheckArea( doc, node );
    }

    /* Check the APPLET tag */
    else if ( nodeIsAPPLET(node) )
    {
        CheckDeprecated( doc, node );
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckApplet(doc, node );
    }
    
    /* Check the OBJECT tag */
    else if ( nodeIsOBJECT(node) )
    {
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckObject( doc, node );
    }
    
    /* Check the FRAME tag */
    else if ( nodeIsFRAME(node) )
    {
        CheckFrame( doc, node );
    }
    
    /* Check the IFRAME tag */
    else if ( nodeIsIFRAME(node) )
    {
        CheckIFrame( doc, node );
    }
    
    /* Check the SCRIPT tag */
    else if ( nodeIsSCRIPT(node) )
    {
        DynamicContent( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckScriptAcc( doc, node );
    }

    /* Check the TABLE tag */
    else if ( nodeIsTABLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckTable( doc, node );
    }

    /* Check the PRE for ASCII art */
    else if ( nodeIsPRE(node) || nodeIsXMP(node) )
    {
        CheckASCII( doc, node );
    }

    /* Check the LABEL tag */
    else if ( nodeIsLABEL(node) )
    {
        CheckLabel( doc, node );
    }

    /* Check INPUT tag for validity */
    else if ( nodeIsINPUT(node) )
    {
        CheckColorAvailable( doc, node );
        CheckInputLabel( doc, node );
        CheckInputAttributes( doc, node );
    }

    /* Checks FRAMESET element for NOFRAME section */
    else if ( nodeIsFRAMESET(node) )
    {
        CheckFrameSet( doc, node );
    }
    
    /* Checks for header elements for valid header increase */
    else if ( TY_(nodeIsHeader)(node) )
    {
        CheckHeaderNesting( doc, node );
    }

    /* Checks P element to ensure that it is not a header */
    else if ( nodeIsP(node) )
    {
        CheckParagraphHeader( doc, node );
    }

    /* Checks HTML elemnt for valid 'LANG' */
    else if ( nodeIsHTML(node) )
    {
        CheckHTMLAccess( doc, node );
    }

    /* Checks BLINK for any blinking text */
    else if ( nodeIsBLINK(node) )
    {
        CheckBlink( doc, node );
    }

    /* Checks MARQUEE for any MARQUEE text */
    else if ( nodeIsMARQUEE(node) )
    {
        CheckMarquee( doc, node );
    }

    /* Checks LINK for 'REL' attribute */
    else if ( nodeIsLINK(node) )
    {
        CheckLink( doc, node );
    }

    /* Checks to see if STYLE is used */
    else if ( nodeIsSTYLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckStyle( doc, node );
    }

    /* Checks to see if EMBED is used */
    else if ( nodeIsEMBED(node) )
    {
        CheckEmbed( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
    }

    /* Deprecated HTML if the following tags are found in the document */
    else if ( nodeIsBASEFONT(node) ||
              nodeIsCENTER(node)   ||
              nodeIsISINDEX(node)  ||
              nodeIsU(node)        ||
              nodeIsFONT(node)     ||
              nodeIsDIR(node)      ||
              nodeIsS(node)        ||
              nodeIsSTRIKE(node)   ||
              nodeIsMENU(node) )
    {
        CheckDeprecated( doc, node );
    }

    /* Checks for 'ABBR' attribute if needed */
    else if ( nodeIsTH(node) )
    {
        CheckTH( doc, node );
    }

    /* Ensures that lists are properly used */
    else if ( nodeIsLI(node) || nodeIsOL(node) || nodeIsUL(node) )
    {
        CheckListUsage( doc, node );
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
    {
        AccessibilityCheckNode( doc, content );
    }
}